

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void google::protobuf::compiler::cpp::anon_unknown_0::
     PrintFieldComment<google::protobuf::FieldDescriptor>(Printer *printer,FieldDescriptor *field)

{
  DebugStringOptions *this;
  string local_60;
  undefined1 local_40 [8];
  string def;
  DebugStringOptions options;
  FieldDescriptor *field_local;
  Printer *printer_local;
  
  this = (DebugStringOptions *)((long)&def.field_2 + 0xd);
  DebugStringOptions::DebugStringOptions(this);
  def.field_2._M_local_buf[0xe] = '\x01';
  def.field_2._M_local_buf[0xf] = '\x01';
  FieldDescriptor::DebugStringWithOptions_abi_cxx11_((string *)local_40,field,this);
  std::__cxx11::string::find_first_of((char)(string *)local_40,10);
  std::__cxx11::string::substr((ulong)&local_60,(ulong)local_40);
  io::Printer::Print(printer,"// $def$\n","def",&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void PrintFieldComment(io::Printer* printer, const T* field) {
  // Print the field's (or oneof's) proto-syntax definition as a comment.
  // We don't want to print group bodies so we cut off after the first
  // line.
  DebugStringOptions options;
  options.elide_group_body = true;
  options.elide_oneof_body = true;
  string def = field->DebugStringWithOptions(options);
  printer->Print("// $def$\n",
    "def", def.substr(0, def.find_first_of('\n')));
}